

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

atom * updateHydrogenInfo(FILE *outf,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
                         atomBins *bbins,int selectedFlag,int mustSaveMainWater)

{
  byte *pbVar1;
  uint uVar2;
  residue_t *prVar3;
  double dVar4;
  FILE *__stream;
  int iVar5;
  atom_t *paVar6;
  atom *paVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  atom *paVar12;
  atom *paVar13;
  atom *paVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  byte bVar19;
  float fVar20;
  double newlen;
  float fVar21;
  double dVar22;
  int dummy;
  uint local_1f4;
  atom *local_1f0;
  atom *local_1e8;
  atomBins *local_1e0;
  atom *local_1d8;
  point3d *local_1d0;
  uint local_1c8;
  int local_1c4;
  FILE *local_1c0;
  atom *local_1b8;
  atom *local_1b0;
  atomBins *local_1a8;
  char *local_1a0;
  atomBins *local_198;
  point3d o2aVec;
  anon_struct_16_2_fa5d6e3e proximity [20];
  
  bVar19 = 0;
  dummy = 0;
  bVar16 = allMovingAtoms != (atom *)0x0;
  bVar17 = bbins != (atomBins *)0x0;
  if (!bVar17) {
    allMovingAtoms = (atom *)0x0;
  }
  local_198 = abins;
  if (bVar17 && bVar16) {
    local_198 = bbins;
  }
  local_1c0 = (FILE *)outf;
  local_1b8 = allMainAtoms;
  local_1b0 = allMovingAtoms;
  if (DumpNewHO == '\x01') {
    fwrite("@vectorlist {water H?} color= gray\n",0x23,1,(FILE *)outf);
  }
  local_1d8 = (atom *)0x0;
  local_1e8 = (atom *)0x0;
  local_1c4 = 0;
  local_1e0 = abins;
  local_1c8 = selectedFlag;
  local_1a8 = bbins;
  do {
    if (local_1c4 == 2) {
      if (local_1d8 != (atom *)0x0) {
        do {
          paVar12 = local_1b0;
          if (paVar12 == (atom *)0x0) {
            return local_1e8;
          }
          local_1b0 = paVar12->next;
        } while (paVar12->next != (atom_t *)0x0);
        paVar12->next = local_1d8;
      }
      return local_1e8;
    }
    bVar18 = local_1c4 == 0;
    paVar12 = local_1b0;
    if (bVar18) {
      paVar12 = local_1b8;
    }
    while (paVar12 != (atom *)0x0) {
      iVar5 = getAtno(paVar12->elem);
      uVar8 = paVar12->flags & selectedFlag;
      paVar7 = paVar12;
      if (iVar5 == 1) {
        if (uVar8 != 0) {
          paVar6 = findTouchingAtoms(paVar12,(atom *)0x0,abins,0.0,0,&dummy);
          if (bVar17 && bVar16) {
            paVar6 = findTouchingAtoms(paVar12,paVar6,bbins,0.0,0,&dummy);
          }
          if (paVar6 != (atom *)0x0) {
            markBonds(paVar12,paVar6,1,1);
            uVar8 = dotType(paVar12,paVar6,(uint)ByNABaseColor);
            if ((uVar8 < 0xc) && ((0xb00U >> (uVar8 & 0x1f) & 1) != 0)) {
              if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
                fprintf(_stderr,"%s%d   \r",paVar12->r->resname,(ulong)(uint)paVar12->r->resid);
              }
              pbVar1 = (byte *)((long)&paVar12->props + 2);
              *pbVar1 = *pbVar1 | 1;
              if (UsePolarH == '\0') {
                paVar12->elem = 4;
                fVar20 = getRadius(4,0);
                paVar12->radius = fVar20;
              }
              fVar20 = paVar12->occ;
              fVar21 = -fVar20;
              if (-fVar20 <= fVar20) {
                fVar21 = fVar20;
              }
              if (((fVar21 < 0.25) || (80.0 <= paVar12->bval)) && ((paVar12->props & 0x400) != 0)) {
                paVar12->elem = 1;
                paVar12->radius = 0.0;
              }
              for (; paVar6 != (atom *)0x0; paVar6 = paVar6->scratch) {
                if ((paVar6->mark == 1) && (iVar5 = getAtno(paVar6->elem), iVar5 != 1)) {
                  fVar20 = paVar12->occ;
                  fVar21 = -fVar20;
                  if (-fVar20 <= fVar20) {
                    fVar21 = fVar20;
                  }
                  if ((0.25 <= fVar21) && (paVar12->bval <= 80.0 && paVar12->bval != 80.0)) {
                    pbVar1 = (byte *)((long)&paVar6->props + 2);
                    *pbVar1 = *pbVar1 & 0xfe;
                  }
                }
              }
            }
          }
        }
      }
      else if (uVar8 != 0) {
        uVar8 = paVar12->props;
        uVar2 = paVar12->elem;
        if ((uVar8 >> 10 & 1) == 0) {
          if ((uVar2 < 0xc) && ((0xb00U >> (uVar2 & 0x1f) & 1) != 0)) {
            paVar12->props = uVar8 & 0xfffefbff;
          }
        }
        else {
          paVar6 = paVar12;
          if ((uVar8 >> 0x10 & 1) != 0 && uVar2 == 9) {
            while ((paVar6 = paVar6->next, paVar6 != (atom_t *)0x0 && (paVar12->r == paVar6->r))) {
              iVar5 = getAtno(paVar6->elem);
              if ((iVar5 == 1) && ((paVar12->altConf == paVar6->altConf && (0.1 < paVar6->occ)))) {
                pbVar1 = (byte *)((long)&paVar12->props + 2);
                *pbVar1 = *pbVar1 & 0xfe;
              }
            }
            uVar8 = paVar12->props;
            abins = local_1e0;
            if ((uVar8 >> 0x10 & 1) != 0) {
              if ((bVar18 && (mustSaveMainWater != 0 && (bVar17 && bVar16))) &&
                 (paVar7 = (atom *)malloc(0x80), paVar7 != (atom *)0x0)) {
                paVar13 = paVar12;
                paVar14 = paVar7;
                for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
                  paVar14->next = paVar13->next;
                  paVar13 = (atom *)((long)paVar13 + (ulong)bVar19 * -0x10 + 8);
                  paVar14 = (atom *)((long)paVar14 + (ulong)bVar19 * -0x10 + 8);
                }
                paVar7->next = local_1e8;
                uVar8 = paVar12->props;
                local_1e8 = paVar7;
              }
              paVar12->props = uVar8 & 0xeffcffff | 0x10020000;
              paVar6 = findTouchingAtoms(paVar12,(atom *)0x0,local_1e0,0.25,0,&dummy);
              if (bVar17 && bVar16) {
                paVar6 = findTouchingAtoms(paVar12,paVar6,bbins,0.25,0,&dummy);
              }
              local_1d0 = &paVar12->loc;
              uVar8 = 0;
              for (; paVar6 != (atom *)0x0; paVar6 = paVar6->scratch) {
                if ((paVar6->props & 0x20000) != 0) {
                  fVar20 = gapSize(&paVar6->loc,local_1d0,paVar6->radius + 2.0);
                  if ((paVar6->props & 0x40000) != 0) {
                    uVar10 = 0;
                    if (0 < (int)uVar8) {
                      uVar10 = (ulong)uVar8;
                    }
                    for (lVar9 = 0; uVar10 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
                      lVar11 = *(long *)((long)&proximity[0].a + lVar9);
                      if ((paVar6->r == *(residue_t **)(lVar11 + 0x70)) &&
                         ((*(byte *)(lVar11 + 0x2a) & 4) != 0)) {
                        if (fVar20 < *(float *)((long)&proximity[0].gap + lVar9)) {
                          *(atom_t **)((long)&proximity[0].a + lVar9) = paVar6;
                          *(float *)((long)&proximity[0].gap + lVar9) = fVar20;
                        }
                        goto LAB_00129189;
                      }
                    }
                  }
                  if (uVar8 < 0x14) {
                    proximity[uVar8].a = paVar6;
                    proximity[uVar8].gap = fVar20;
                    uVar8 = uVar8 + 1;
                  }
                }
LAB_00129189:
              }
              uVar15 = 0;
              uVar10 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar10 = uVar15;
              }
              local_1a0 = paVar12->atomname;
              local_1f4 = 0;
              local_1f0 = paVar12;
              for (; paVar7 = local_1f0, abins = local_1e0, bbins = local_1a8,
                  selectedFlag = local_1c8, uVar10 * 0x10 != uVar15; uVar15 = uVar15 + 0x10) {
                lVar9 = *(long *)((long)&proximity[0].a + uVar15);
                if (((*(byte *)(lVar9 + 0x2a) & 2) != 0) &&
                   (paVar7 = (atom *)malloc(0x80), paVar7 != (atom *)0x0)) {
                  paVar13 = paVar12;
                  paVar14 = paVar7;
                  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                    paVar14->next = paVar13->next;
                    paVar13 = (atom *)((long)paVar13 + (ulong)bVar19 * -0x10 + 8);
                    paVar14 = (atom *)((long)paVar14 + (ulong)bVar19 * -0x10 + 8);
                  }
                  if (bVar17 && bVar16) {
                    paVar7->next = local_1d8;
                    local_1d8 = paVar7;
                  }
                  else {
                    paVar7->next = local_1f0->next;
                    local_1f0->next = paVar7;
                  }
                  v3sub((vector3d *)(lVar9 + 0x38),local_1d0,&o2aVec);
                  dVar22 = (double)*(float *)((long)&proximity[0].gap + uVar15) + 0.6;
                  newlen = (double)(~-(ulong)(dVar22 < -1.0) & 0x3ff0000000000000 |
                                   (ulong)((uint)(-(ulong)(0.0 < dVar22) >> 0x20) & 0x3ff00000 &
                                          (uint)(-(ulong)(dVar22 < -1.0) >> 0x20)) << 0x20);
                  dVar4 = newlen;
                  if (dVar22 <= 0.0) {
                    dVar4 = dVar22 + 1.0;
                  }
                  if (-1.0 <= dVar22) {
                    newlen = dVar4;
                  }
                  v3scale(&o2aVec,newlen);
                  v3add(local_1d0,&o2aVec,&paVar7->loc);
                  paVar7->nextInBin = (atom_t *)0x0;
                  paVar7->scratch = (atom_t *)0x0;
                  paVar7->elem = 5;
                  fVar20 = getRadius(5,0);
                  paVar7->radius = fVar20;
                  fVar20 = getCovRad(paVar7->elem);
                  paVar7->covRad = fVar20;
                  builtin_strncpy(paVar7->atomname," H? ",5);
                  paVar7->props = paVar7->props & 0xfffcffffU | 0x10000;
                  addNeighbor(paVar7,local_198);
                  if (DumpNewHO == '\x01') {
                    if (3 < DebugLevel) {
                      local_1f4 = local_1f4 + 1;
                      prVar3 = paVar7->r;
                      fprintf(_stderr,
                              "HETATM%5d  H%-2d%c%3.3s%s%4.4s%c   %8.3f%8.3f%8.3f%6.2f%6.2f      new  H\n"
                              ,(paVar7->loc).x,(paVar7->loc).y,SUB84((paVar7->loc).z,0),
                              (double)paVar7->occ,(double)paVar7->bval,0,(ulong)local_1f4,
                              (ulong)(uint)(int)paVar7->altConf,prVar3->resname,prVar3->chain,
                              prVar3->Hy36resno,(ulong)(uint)(int)prVar3->resInsCode);
                    }
                    __stream = local_1c0;
                    prVar3 = paVar12->r;
                    fprintf(local_1c0,"{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",(paVar12->loc).x,
                            (paVar12->loc).y,SUB84((paVar12->loc).z,0),local_1a0,
                            (ulong)(uint)(int)paVar12->altConf,prVar3->resname,prVar3->chain,
                            prVar3->Hy36resno,(ulong)(uint)(int)prVar3->resInsCode);
                    prVar3 = paVar7->r;
                    fprintf(__stream,"{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",(paVar7->loc).x,
                            (paVar7->loc).y,paVar7->atomname,(ulong)(uint)(int)paVar7->altConf,
                            prVar3->resname,prVar3->chain,prVar3->Hy36resno,
                            (ulong)(uint)(int)prVar3->resInsCode);
                  }
                  if (!bVar17 || !bVar16) {
                    local_1f0 = local_1f0->next;
                  }
                }
              }
            }
          }
        }
      }
      paVar12 = paVar7->next;
    }
    local_1c4 = local_1c4 + 1;
  } while( true );
}

Assistant:

atom* updateHydrogenInfo(FILE *outf, atom *allMainAtoms,   atomBins *abins,
                    atom *allMovingAtoms, atomBins *bbins,
                    int selectedFlag, int mustSaveMainWater)
{/*updateHydrogenInfo*/
   atom *src = NULL, *orig = NULL, *atomList = NULL, *a = NULL;
   atom *newH = NULL, *tempStaticList = NULL, *mainWaterStorage = NULL;
   int type = 0, newHcount = 0, i = 0, whichList = 0;
   int nProx = 0, usesMovingAtoms = FALSE;
   int dummy = FALSE;

   /* Information specific to making sure only one H2O Hydrogen is     */
   /* generated which points into ring atoms on a given aromatic ring. */
   struct {atom  *a; float gap;} proximity[20];

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms) { allMovingAtoms = NULL; bbins = NULL; }

   if (DumpNewHO) { fprintf(outf,"@vectorlist {water H?} color= gray\n"); }

   tempStaticList = NULL; /* new hydrogens for MainAtoms when usesMovingAtoms */
   mainWaterStorage = NULL; /* MainAtoms waters when usesMovingAtoms          */

   for(whichList = 0; whichList <= 1; whichList++)
   { /* loop over both lists of atoms */
      for(src = ((whichList==0)?allMainAtoms:allMovingAtoms); src; src = src->next)
      {/*loop over src atoms*/

         /* Note: we have to examine ALL the atoms at this point.        */
         /* Not testing (src->flags & selectedFlag) for H will slow down */
         /* the code but it is neccessary to get the atom types correct. */

         if (isHatom(src->elem))
         { /* fixup Hs in the input */

            atomList = NULL;
            if (src->flags & selectedFlag)
            {
               atomList = findTouchingAtoms(src, NULL, abins, 0.0, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
               }
            }
            if (atomList)
            {
               markBonds(src, atomList, 1, 1); /*in updateHydrogenInfo()*/
               type = dotType(src, atomList, ByNABaseColor);

               if ( type == atomN || type == atomO || type == atomS )
               {/* bgn: if (atom types) */
                  if(Verbose && ShowTicks)
                  {
                     fprintf(stderr, "%s%d   \r",src->r->resname, src->r->resid);
                  }
                  src->props |= DONOR_PROP; /* polar hydrogens are donors */

                  if (UsePolarH)
                  {
                     src->elem = atomHpolar; /* very important */
                     src->radius = getRadius(src->elem, 0);
                  }
/* there are a more restrictive set of cutoffs in reduce: 0.7 & 40 */
#define H2OoccCUTTOFF   0.25
#define H2ObvalCUTTOFF 80.0
                  if (  (   FABS(src->occ) < H2OoccCUTTOFF
                         || src->bval >= H2ObvalCUTTOFF   )
                      &&(src->props & WATER_PROP)          )
                  {
                     src->elem = ignoreAtom;
                     src->radius = 0.0;
                  } /* ignore low occupancy High B water hydrogens */

                  for(a = atomList; a; a = a->scratch)
                  {
                     /* since we found a hydrogen, then we know */
                     /* that the heavy atom is not the donor    */
                     /* so we can disable that property         */
                     if(    (a->mark == 1)
                        && !(isHatom(a->elem))
                        &&  (FABS(src->occ) >= H2OoccCUTTOFF)
                        &&  (src->bval < H2ObvalCUTTOFF)     )
                     {

                        a->props &= ~DONOR_PROP; /*set to one's complement of ...*/
                     }
                  }
               }/* end: if (atom types) */
            }
         }/* fixup Hs in the input */
         else if (   (src->flags & selectedFlag)  /* fixup water oxygen */
                  && (src->props & WATER_PROP)
                  && (src->elem == atomO)       )
         {/* else if water */ /* fixup water oxygen */

            /*if connected H already found, the DONOR prop will not be set*/
            /*if it is, we look further ahead in this residue for Hs      */
            if (src->props & DONOR_PROP)
            {
               for(a = src->next; a && (src->r == a->r); a = a->next)
               {
                  if (  isHatom(a->elem)
                      && (src->altConf == a->altConf)
                      && (a->occ > 0.1))
                  {
                     src->props &= ~DONOR_PROP; /* turn off donor property */
                  }
               }
            }
            /* if donor flag still set...  */
            if (src->props & DONOR_PROP)
            {/* water O without occupied Hs */

               /* begin clone procedure */
               /* special case for when we want to remember just these waters */
               /* in this state                                               */
               if (mustSaveMainWater && usesMovingAtoms && (whichList==0))
               {
                  atom* waterClone = NULL;
                  waterClone = (atom *)malloc(sizeof(atom));
                  if (waterClone)
                  {
                     *waterClone = *src;
                     waterClone->next = mainWaterStorage; /* add clone to list */
                     mainWaterStorage = waterClone;
                  }
               }
               /* end clone procedure */

               src->props |= AMBIGWATER_PROP; /* this is a water which needs H? added */
               src->props |=  ACCEPTOR_PROP;
               src->props &= ~DONOR_PROP;    /* acceptor, not donor */
               orig = src; /* keep track of the original Oxygen atom */
               atomList = findTouchingAtoms(src, NULL, abins, 0.25, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.25, 0, &dummy);
               }
               /* the 0.25 comes from:
                  OxygenVDW(1.4) + 2*probeRad(0.3) == HpolVDW(1.0) + OHBondLen(1.0)
                  and we want a minimum overlap of 0.1 before we consider possible Hs
               */

              /* for each nearby HB acceptor, keep only 1 per aromatic ring */
              nProx = 0;
              for(a = atomList; a; a = a->scratch)
              {
                 if (a->props & ACCEPTOR_PROP)
                 {/* bgn: if acceptor_prop */
                    float hbgap = gapSize(&(a->loc), &(orig->loc), a->radius + 2.0f);
                    int   foundAromRingAtom = FALSE;

                    if (a->props & AROMATIC_PROP)
                    {
                       for (i=0; i < nProx; i++)
                       {
                          if (   a->r == proximity[i].a->r
                              && proximity[i].a->props & AROMATIC_PROP)
                          {

                             if (hbgap < proximity[i].gap)
                             {
                                proximity[i].a = a;
                                proximity[i].gap = hbgap;
                             }
                             foundAromRingAtom = TRUE;
                             break;
                          }
                       }
                    }
                    if (   (!foundAromRingAtom)
                        && nProx < sizeof(proximity)/sizeof(proximity[0]))
                    {
                       proximity[nProx].a = a;
                       proximity[nProx].gap  = hbgap;
                       ++nProx;
                    }
                 }/* end: if acceptor_prop */
              }

              /* build new HOH hydrogens in the direction of each acceptor */
              newHcount = 0;
              for (i=0; i < nProx; i++)
              {/*scan over neighbors*/

                 a = proximity[i].a;

                 if (a->props & ACCEPTOR_PROP)
                 {/*close acceptor! Make a phantom H in the direction of each Acceptor*/
                    newH = (atom *)malloc(sizeof(atom));
                    if (newH)
                    {/*newH allocated, set its parameters*/
                       point3d o2aVec;
                       double waterOHbondLen;

                       *newH = *orig;
                       if (usesMovingAtoms)
                       {
                          newH->next = tempStaticList; /* hook into temp list */
                          tempStaticList = newH;
                       }
                       else
                       {
                          newH->next = src->next; /* hook into list of atoms */
                          src->next  = newH;
                       }

                       v3sub(&(a->loc), &(orig->loc), &o2aVec);
#define BEST_HBOND_OVERLAP 0.6
                       waterOHbondLen = 1.0 +
                       MAX(-1.0, MIN(0.0, proximity[i].gap + BEST_HBOND_OVERLAP));
                       v3scale(&o2aVec, waterOHbondLen);
                       v3add(&(orig->loc), &o2aVec, &(newH->loc));

                       newH->nextInBin= NULL; /* added to bins below */
                       newH->scratch  = NULL;
                       newH->elem     = atomHOd; /*hb-only-dummy, phantom H atom*/
                       newH->radius   = getRadius(newH->elem, 0);
                       newH->covRad   = getCovRad(newH->elem);
                          /*atomprops.h/atomProp AtomTbl covRad*/
                       strcpy(newH->atomname, " H? ");

                       newH->props |=  DONOR_PROP;
                       newH->props &= ~ACCEPTOR_PROP; /* donor, not acceptor */

                       /* *** adding an atom not in input! *** */
                       addNeighbor(newH, (usesMovingAtoms ? bbins : abins));

                       if (DumpNewHO)
                       {
                          if (DebugLevel>3)
                          {
                             fprintf(stderr,
"HETATM%5d  H%-2d%c%3.3s%s%4.4s%c   %8.3f%8.3f%8.3f%6.2f%6.2f      new  H\n",
                                0, ++newHcount, newH->altConf,
                                newH->r->resname, newH->r->chain,
                                newH->r->Hy36resno, newH->r->resInsCode,
                                newH->loc.x, newH->loc.y, newH->loc.z,
                                newH->occ, newH->bval);
                          }
                          fprintf(outf, "{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
                             orig->atomname, orig->altConf,
                             orig->r->resname, orig->r->chain,
                             orig->r->Hy36resno, orig->r->resInsCode,
                             orig->loc.x, orig->loc.y, orig->loc.z);
                          fprintf(outf, "{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",
                             newH->atomname, newH->altConf,
                             newH->r->resname, newH->r->chain,
                             newH->r->Hy36resno, newH->r->resInsCode,
                             newH->loc.x, newH->loc.y, newH->loc.z);
                       }

                       if (! usesMovingAtoms)
                       {
                          src = src->next; /* bypass new atom when we iterate */
                                           /* when inserted after src atom    */
                       }
                    }/*newH allocated, set its parameters*/
                 }/*close acceptor! Make a phantom H in the direction of each Acceptor*/
              }/*scan over neighbors*/

            }/* water O without occupied Hs */
         }/* else if water */ /* fixup water oxygen */

         /* non-water polar (N/O/S) atoms in selection list */
         else if (    (src->flags & selectedFlag) && !(src->props & WATER_PROP)
                  &&  (src->elem == atomN || src->elem == atomO || src->elem == atomS))
         {
            /* Remove any DONOR property for non-water non-H            */
            /* polar atoms since the Hydrogen atoms will be the DONORs. */
            /* This was assigned in select.c to facilitate selections.  */

            src->props &= ~DONOR_PROP;
         }
      }/*loop over src atoms */ /* end loop over list of src atoms*/
   }/* loop over both lists of atoms */

   if (tempStaticList)
   {/* new hydrogens for MainAtoms when usesMovingAtoms */
      for(src = allMovingAtoms; src; src = src->next)
      {
         if (src->next == NULL)
         {
            src->next = tempStaticList;
            break; /* make sure we don't continually loop */
         }
      }
   }
   return mainWaterStorage;
}